

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<int,_bool,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Remove(BaseDictionary<int,_bool,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this,int *key)

{
  Type piVar1;
  Type pSVar2;
  uint uVar3;
  ulong in_RAX;
  int *piVar4;
  uint depth;
  uint unaff_R13D;
  uint uVar5;
  bool bVar6;
  ulong uStack_38;
  
  piVar1 = this->buckets;
  depth = 0;
  if (piVar1 == (Type)0x0) {
    uVar5 = 0;
    uStack_38 = in_RAX;
  }
  else {
    uVar3 = GetBucket(*key * 2 + 1,this->bucketCount,this->modFunctionIndex);
    uStack_38 = (ulong)uVar3 << 0x20;
    unaff_R13D = piVar1[uVar3];
    if (-1 < (long)(int)unaff_R13D) {
      pSVar2 = this->entries;
      if (pSVar2[(int)unaff_R13D].
          super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
          super_KeyValueEntry<int,_bool>.
          super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>
          .super_KeyValueEntryDataLayout2<int,_bool>.key == *key) {
        depth = 0;
        uVar5 = 0xffffffff;
      }
      else {
        depth = 0;
        do {
          uVar5 = unaff_R13D;
          depth = depth + 1;
          unaff_R13D = pSVar2[uVar5].
                       super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .super_KeyValueEntry<int,_bool>.
                       super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>
                       .super_KeyValueEntryDataLayout2<int,_bool>.next;
          if ((long)(int)unaff_R13D < 0) goto LAB_00d0e85f;
        } while (pSVar2[(int)unaff_R13D].
                 super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
                 super_KeyValueEntry<int,_bool>.
                 super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>
                 .super_KeyValueEntryDataLayout2<int,_bool>.key != *key);
      }
      bVar6 = true;
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(this->stats,depth);
      }
      goto LAB_00d0e873;
    }
    uVar5 = 0xffffffff;
  }
LAB_00d0e85f:
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,depth);
  }
  bVar6 = false;
LAB_00d0e873:
  if (bVar6 != false) {
    piVar4 = &this->entries[uVar5].
              super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
              super_KeyValueEntry<int,_bool>.
              super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>
              .super_KeyValueEntryDataLayout2<int,_bool>.next;
    if ((int)uVar5 < 0) {
      piVar4 = this->buckets + (uStack_38 >> 0x20);
    }
    *piVar4 = this->entries[(int)unaff_R13D].
              super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
              super_KeyValueEntry<int,_bool>.
              super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>
              .super_KeyValueEntryDataLayout2<int,_bool>.next;
    pSVar2 = this->entries;
    pSVar2[(int)unaff_R13D].
    super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
    super_KeyValueEntry<int,_bool>.
    super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>.
    super_KeyValueEntryDataLayout2<int,_bool>.value = false;
    pSVar2[(int)unaff_R13D].
    super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
    super_KeyValueEntry<int,_bool>.
    super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>.
    super_KeyValueEntryDataLayout2<int,_bool>.key = 0;
    SetNextFreeEntryIndex
              (this,pSVar2 + (int)unaff_R13D,-(uint)(this->freeCount == 0) | this->freeList);
    this->freeList = unaff_R13D;
    this->freeCount = this->freeCount + 1;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Remove(this->stats,this->buckets[uStack_38 >> 0x20] == -1);
    }
  }
  return bVar6;
}

Assistant:

bool Remove(const TKey& key)
        {
            int i, last;
            uint targetBucket;
            if(FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }